

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

string * __thiscall
google::protobuf::internal::ArenaStringPtr::Release_abi_cxx11_(ArenaStringPtr *this)

{
  bool bVar1;
  string *local_68;
  string *local_28;
  string *released;
  ArenaStringPtr *pAStack_18;
  ScopedCheckPtrInvariants check;
  ArenaStringPtr *this_local;
  
  pAStack_18 = this;
  anon_unknown_7::ScopedCheckPtrInvariants::ScopedCheckPtrInvariants
            ((ScopedCheckPtrInvariants *)((long)&released + 7),&this->tagged_ptr_);
  bVar1 = IsDefault(this);
  if (bVar1) {
    this_local = (ArenaStringPtr *)0x0;
  }
  else {
    local_28 = TaggedStringPtr::Get_abi_cxx11_(&this->tagged_ptr_);
    bVar1 = TaggedStringPtr::IsArena(&this->tagged_ptr_);
    if (bVar1) {
      bVar1 = TaggedStringPtr::IsMutable(&this->tagged_ptr_);
      if (bVar1) {
        local_68 = (string *)operator_new(0x20);
        std::__cxx11::string::string((string *)local_68,(string *)local_28);
      }
      else {
        local_68 = (string *)operator_new(0x20);
        std::__cxx11::string::string((string *)local_68,(string *)local_28);
      }
      local_28 = local_68;
    }
    InitDefault(this);
    this_local = (ArenaStringPtr *)local_28;
  }
  return (string *)this_local;
}

Assistant:

std::string* ArenaStringPtr::Release() {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) return nullptr;

  std::string* released = tagged_ptr_.Get();
  if (tagged_ptr_.IsArena()) {
    released = tagged_ptr_.IsMutable() ? new std::string(std::move(*released))
                                       : new std::string(*released);
  }
  InitDefault();
  return released;
}